

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::RealisticCamera::RealisticCamera
          (RealisticCamera *this,CameraBaseParameters *baseParameters,
          vector<float,_std::allocator<float>_> *lensParameters,Float focusDistance,
          Float setApertureDiameter,Image *apertureImage,Allocator alloc)

{
  Point2<float> p2;
  Point2<float> p1;
  ulong uVar1;
  vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *this_00;
  Tuple2<pbrt::Point2,_int> this_01;
  Tuple2<pbrt::Point2,_int> args;
  size_type sVar2;
  reference pvVar3;
  reference __f;
  RealisticCamera *pRVar4;
  vector<float,_std::allocator<float>_> *in_RDX;
  long in_RDI;
  float fVar5;
  Float v;
  float fVar6;
  float fVar7;
  float fVar8;
  Float FVar9;
  double dVar10;
  undefined1 auVar11 [16];
  float in_XMM1_Da;
  int nSamples;
  Float apertureDiameter;
  Float eta;
  Float thickness;
  Float curvatureRadius;
  size_t i;
  Float y;
  Float x;
  Float diagonal;
  Float aspect;
  Camera *in_stack_00000358;
  CameraBase *in_stack_00000360;
  CameraBaseParameters *in_stack_fffffffffffffb28;
  CameraBaseParameters *in_stack_fffffffffffffb30;
  Camera *this_02;
  CameraBaseParameters *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  polymorphic_allocator<pbrt::Bounds2<float>_> *alloc_00;
  Camera local_430 [4];
  int local_40c;
  float local_408;
  float local_404;
  value_type local_400;
  float local_3fc;
  float local_3f8;
  value_type local_3f4;
  float local_3f0;
  float local_3ec;
  ulong local_3e8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  float local_3c0;
  float local_3bc;
  Float local_3b8;
  Tuple2<pbrt::Point2,_int> local_3b4;
  Tuple2<pbrt::Point2,_int> local_3ac;
  float local_3a4;
  polymorphic_allocator<pbrt::Bounds2<float>_> local_3a0 [3];
  polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface> local_388 [108];
  float local_28;
  vector<float,_std::allocator<float>_> *local_20;
  
  local_28 = in_XMM1_Da;
  local_20 = in_RDX;
  CameraBaseParameters::CameraBaseParameters(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  CameraBase::CameraBase
            ((CameraBase *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             in_stack_fffffffffffffb38);
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>::
  polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface> *)
             in_stack_fffffffffffffb30,(polymorphic_allocator<std::byte> *)in_stack_fffffffffffffb28
            );
  pstd::
  vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
  ::vector((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
            *)(in_RDI + 0x390),local_388);
  Image::Image((Image *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (Image *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  this_00 = (vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
             *)(in_RDI + 0x448);
  alloc_00 = local_3a0;
  pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::Bounds2<float>_> *)in_stack_fffffffffffffb30,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffb28);
  pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
  vector(this_00,alloc_00);
  this_01 = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffb28);
  local_3ac.y = this_01.y;
  fVar5 = (float)local_3ac.y;
  local_3ac = this_01;
  args = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffb28);
  local_3b4.x = args.x;
  local_3a4 = fVar5 / (float)local_3b4.x;
  local_3b4 = args;
  v = Film::Diagonal((Film *)in_stack_fffffffffffffb30);
  local_3b8 = v;
  fVar6 = Sqr<float>(v);
  fVar7 = Sqr<float>(local_3a4);
  auVar11._0_4_ = fVar6 / (fVar7 + 1.0);
  auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
  dVar10 = std::sqrt(auVar11._0_8_);
  fVar8 = SUB84(dVar10,0);
  local_3c0 = local_3a4 * fVar8;
  local_3bc = fVar8;
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffb30,
             (float)((ulong)in_stack_fffffffffffffb28 >> 0x20),SUB84(in_stack_fffffffffffffb28,0));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffb30,
             (float)((ulong)in_stack_fffffffffffffb28 >> 0x20),SUB84(in_stack_fffffffffffffb28,0));
  p1.super_Tuple2<pbrt::Point2,_float>.y = fVar5;
  p1.super_Tuple2<pbrt::Point2,_float>.x = v;
  p2.super_Tuple2<pbrt::Point2,_float>.y = fVar6;
  p2.super_Tuple2<pbrt::Point2,_float>.x = fVar7;
  Bounds2<float>::Bounds2((Bounds2<float> *)CONCAT44(fVar8,in_stack_fffffffffffffb50),p1,p2);
  *(undefined8 *)(in_RDI + 0x380) = local_3d0;
  *(undefined8 *)(in_RDI + 0x388) = local_3c8;
  for (local_3e8 = 0; uVar1 = local_3e8,
      sVar2 = std::vector<float,_std::allocator<float>_>::size(local_20), uVar1 < sVar2;
      local_3e8 = local_3e8 + 4) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_20,local_3e8);
    local_3ec = *pvVar3 / 1000.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_20,local_3e8 + 1);
    local_3f0 = *pvVar3 / 1000.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_20,local_3e8 + 2);
    local_3f4 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_20,local_3e8 + 3);
    local_3f8 = *pvVar3 / 1000.0;
    fVar8 = local_3f8;
    if (((local_3ec == 0.0) && (!NAN(local_3ec))) &&
       (local_28 = local_28 / 1000.0, fVar8 = local_28, local_3f8 < local_28)) {
      Warning<float&,float&>((char *)this_01,(float *)args,(float *)CONCAT44(fVar5,v));
      fVar8 = local_3f8;
    }
    local_3f8 = fVar8;
    local_408 = local_3ec;
    local_404 = local_3f0;
    local_400 = local_3f4;
    local_3fc = local_3f8 * 0.5;
    pstd::
    vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
    ::push_back((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                (LensElementInterface *)in_stack_fffffffffffffb38);
  }
  FVar9 = FocusThickLens((RealisticCamera *)this_01,(Float)args.y);
  __f = pstd::
        vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
        ::back((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                *)(in_RDI + 0x390));
  __f->thickness = FVar9;
  local_40c = 0x40;
  pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
  resize((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *)
         CONCAT44(fVar5,v),CONCAT44(fVar6,fVar7));
  pRVar4 = (RealisticCamera *)(long)local_40c;
  this_02 = local_430;
  std::function<void(long)>::
  function<pbrt::RealisticCamera::RealisticCamera(pbrt::CameraBaseParameters,std::vector<float,std::allocator<float>>&,float,float,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>)::__0,void>
            ((function<void_(long)> *)CONCAT44(FVar9,in_stack_fffffffffffffb40),
             (anon_class_16_2_dbd4225c *)__f);
  ParallelFor((int64_t)alloc_00,(int64_t)this_00,(function<void_(long)> *)this_01);
  std::function<void_(long)>::~function((function<void_(long)> *)0x8a8109);
  Camera::TaggedPointer<pbrt::RealisticCamera>(this_02,pRVar4);
  CameraBase::FindMinimumDifferentials(in_stack_00000360,in_stack_00000358);
  return;
}

Assistant:

RealisticCamera::RealisticCamera(CameraBaseParameters baseParameters,
                                 std::vector<Float> &lensParameters, Float focusDistance,
                                 Float setApertureDiameter, Image apertureImage,
                                 Allocator alloc)
    : CameraBase(baseParameters),
      elementInterfaces(alloc),
      exitPupilBounds(alloc),
      apertureImage(std::move(apertureImage)) {
    // Compute film's physical extent
    Float aspect = (Float)film.FullResolution().y / (Float)film.FullResolution().x;
    Float diagonal = film.Diagonal();
    Float x = std::sqrt(Sqr(diagonal) / (1 + Sqr(aspect)));
    Float y = aspect * x;
    physicalExtent = Bounds2f(Point2f(-x / 2, -y / 2), Point2f(x / 2, y / 2));

    // Initialize _elementInterfaces_ for camera
    for (size_t i = 0; i < lensParameters.size(); i += 4) {
        // Extract lens element configuration from _lensParameters_
        Float curvatureRadius = lensParameters[i] / 1000;
        Float thickness = lensParameters[i + 1] / 1000;
        Float eta = lensParameters[i + 2];
        Float apertureDiameter = lensParameters[i + 3] / 1000;

        if (curvatureRadius == 0) {
            // Set aperture stop diameter
            setApertureDiameter /= 1000;
            if (setApertureDiameter > apertureDiameter)
                Warning("Aperture diameter %f is greater than maximum possible %f. "
                        "Clamping it.",
                        setApertureDiameter, apertureDiameter);
            else
                apertureDiameter = setApertureDiameter;
        }
        // Add element interface to end of _elementInterfaces_
        elementInterfaces.push_back(
            {curvatureRadius, thickness, eta, apertureDiameter / 2});
    }

    // Compute lens--film distance for given focus distance
    elementInterfaces.back().thickness = FocusThickLens(focusDistance);

    // Compute exit pupil bounds at sampled points on the film
    int nSamples = 64;
    exitPupilBounds.resize(nSamples);
    ParallelFor(0, nSamples, [&](int i) {
        Float r0 = (Float)i / nSamples * film.Diagonal() / 2;
        Float r1 = (Float)(i + 1) / nSamples * film.Diagonal() / 2;
        exitPupilBounds[i] = BoundExitPupil(r0, r1);
    });

    // Compute minimum differentials for _RealisticCamera_
    FindMinimumDifferentials(this);
}